

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# blas1_d.cpp
# Opt level: O0

int idamax(int n,double *dx,int incx)

{
  int local_34;
  int local_30;
  int value;
  int ix;
  int i;
  double dmax;
  int incx_local;
  double *dx_local;
  int n_local;
  
  if ((n < 1) || (incx < 1)) {
    dx_local._4_4_ = 0;
  }
  else {
    local_34 = 1;
    if (n == 1) {
      dx_local._4_4_ = 1;
    }
    else {
      if (incx == 1) {
        _ix = ABS(*dx);
        for (value = 1; value < n; value = value + 1) {
          if (_ix < ABS(dx[value])) {
            local_34 = value + 1;
            _ix = ABS(dx[value]);
          }
        }
      }
      else {
        _ix = ABS(*dx);
        local_30 = incx;
        for (value = 1; value < n; value = value + 1) {
          if (_ix < ABS(dx[local_30])) {
            local_34 = value + 1;
            _ix = ABS(dx[local_30]);
          }
          local_30 = local_30 + incx;
        }
      }
      dx_local._4_4_ = local_34;
    }
  }
  return dx_local._4_4_;
}

Assistant:

int idamax ( int n, double dx[], int incx )

//****************************************************************************80
//
//  Purpose:
//
//    IDAMAX finds the index of the vector element of maximum absolute value.
//
//  Discussion:
//
//    WARNING: This index is a 1-based index, not a 0-based index!
//
//  Licensing:
//
//    This code is distributed under the GNU LGPL license.
//
//  Modified:
//
//    02 May 2005
//
//  Author:
//
//    Original FORTRAN77 version by Charles Lawson, Richard Hanson, 
//    David Kincaid, Fred Krogh.
//    C++ version by John Burkardt.
//
//  Reference:
//
//    Jack Dongarra, Jim Bunch, Cleve Moler, Pete Stewart,
//    LINPACK User's Guide,
//    SIAM, 1979,
//    ISBN13: 978-0-898711-72-1,
//    LC: QA214.L56.
//
//    Charles Lawson, Richard Hanson, David Kincaid, Fred Krogh,
//    Basic Linear Algebra Subprograms for Fortran Usage,
//    Algorithm 539,
//    ACM Transactions on Mathematical Software,
//    Volume 5, Number 3, September 1979, pages 308-323.
//
//  Parameters:
//
//    Input, int N, the number of entries in the vector.
//
//    Input, double X[*], the vector to be examined.
//
//    Input, int INCX, the increment between successive entries of SX.
//
//    Output, int IDAMAX, the index of the element of maximum
//    absolute value.
//
{
  double dmax;
  int i;
  int ix;
  int value;

  value = 0;

  if ( n < 1 || incx <= 0 )
  {
    return value;
  }

  value = 1;

  if ( n == 1 )
  {
    return value;
  }

  if ( incx == 1 )
  {
    dmax = fabs ( dx[0] );

    for ( i = 1; i < n; i++ )
    {
      if ( dmax < fabs ( dx[i] ) )
      {
        value = i + 1;
        dmax = fabs ( dx[i] );
      }
    }
  }
  else
  {
    ix = 0;
    dmax = fabs ( dx[0] );
    ix = ix + incx;

    for ( i = 1; i < n; i++ )
    {
      if ( dmax < fabs ( dx[ix] ) )
      {
        value = i + 1;
        dmax = fabs ( dx[ix] );
      }
      ix = ix + incx;
    }
  }

  return value;
}